

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

char * booster::locale::details::string_cast_traits<char>::cast(char *msg,string *buffer)

{
  char c_00;
  bool bVar1;
  char *pcVar2;
  string *in_RSI;
  char *in_RDI;
  char c;
  char *in_stack_ffffffffffffffd8;
  string *psVar3;
  char *local_10;
  char *local_8;
  
  bVar1 = is_us_ascii_string(in_stack_ffffffffffffffd8);
  local_8 = in_RDI;
  if (!bVar1) {
    psVar3 = in_RSI;
    strlen(in_RDI);
    std::__cxx11::string::reserve((ulong)psVar3);
    local_10 = in_RDI;
    while( true ) {
      pcVar2 = local_10 + 1;
      c_00 = *local_10;
      if (c_00 == '\0') break;
      bVar1 = is_us_ascii_char(c_00);
      local_10 = pcVar2;
      if (bVar1) {
        std::__cxx11::string::operator+=(in_RSI,c_00);
      }
    }
    local_8 = (char *)std::__cxx11::string::c_str();
  }
  return local_8;
}

Assistant:

static char const *cast(char const *msg,std::string &buffer)
                {
                    if(is_us_ascii_string(msg))
                        return msg;
                    buffer.reserve(strlen(msg));
                    char c;
                    while((c=*msg++)!=0) {
                        if(is_us_ascii_char(c))
                            buffer+=c;
                    }
                    return buffer.c_str();
                }